

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O0

int __thiscall strict_fstream::ifstream::open(ifstream *this,char *__file,int __oflag,...)

{
  ios *s_p;
  int extraout_EAX;
  openmode oStack0000000000000104;
  undefined8 in_stack_00000100;
  string *in_stack_00000108;
  openmode oStack0000000000000114;
  ios *in_stack_00000110;
  string *in_stack_00000118;
  istream *in_stack_00000120;
  openmode oStack000000000000014c;
  undefined8 in_stack_00000148;
  string *in_stack_00000150;
  _Ios_Openmode in_stack_ffffffffffffffdc;
  
  s_p = in_stack_00000110;
  oStack000000000000014c = (openmode)((ulong)in_stack_00000148 >> 0x20);
  oStack0000000000000114 = (openmode)((ulong)in_stack_00000110 >> 0x20);
  oStack0000000000000104 = (openmode)((ulong)in_stack_00000100 >> 0x20);
  std::operator|=((_Ios_Openmode *)this,in_stack_ffffffffffffffdc);
  std::ios::exceptions((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
  detail::static_method_holder::check_mode(in_stack_00000150,oStack000000000000014c);
  std::ifstream::open((string *)this,(_Ios_Openmode)__file);
  detail::static_method_holder::check_open(s_p,in_stack_00000108,oStack0000000000000104);
  detail::static_method_holder::check_peek
            (in_stack_00000120,in_stack_00000118,oStack0000000000000114);
  return extraout_EAX;
}

Assistant:

void open(const std::string& filename, std::ios_base::openmode mode = std::ios_base::in)
    {
        mode |= std::ios_base::in;
        exceptions(std::ios_base::badbit);
        detail::static_method_holder::check_mode(filename, mode);
        std::ifstream::open(filename, mode);
        detail::static_method_holder::check_open(this, filename, mode);
        detail::static_method_holder::check_peek(this, filename, mode);
    }